

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkippedTest.cpp
# Opt level: O2

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::SkippedTest::result(SkippedTest *this)

{
  __uniq_ptr_impl<oout::SuccessResult,_std::default_delete<oout::SuccessResult>_> _Var1;
  unique_ptr<oout::SuccessResult,_std::default_delete<oout::SuccessResult>_> local_20;
  __uniq_ptr_impl<oout::SuccessResult,_std::default_delete<oout::SuccessResult>_> local_18;
  
  std::make_unique<oout::SuccessResult>();
  std::
  make_unique<oout::TestResult,std::unique_ptr<oout::SuccessResult,std::default_delete<oout::SuccessResult>>>
            ((unique_ptr<oout::SuccessResult,_std::default_delete<oout::SuccessResult>_> *)&local_18
            );
  _Var1._M_t.
  super__Tuple_impl<0UL,_oout::SuccessResult_*,_std::default_delete<oout::SuccessResult>_>.
  super__Head_base<0UL,_oout::SuccessResult_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_oout::SuccessResult_*,_std::default_delete<oout::SuccessResult>_>.
       super__Head_base<0UL,_oout::SuccessResult_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_oout::SuccessResult_*,_std::default_delete<oout::SuccessResult>_>.
  super__Head_base<0UL,_oout::SuccessResult_*,_false>._M_head_impl =
       (tuple<oout::SuccessResult_*,_std::default_delete<oout::SuccessResult>_>)
       (_Tuple_impl<0UL,_oout::SuccessResult_*,_std::default_delete<oout::SuccessResult>_>)0x0;
  (this->super_Test)._vptr_Test =
       (_func_int **)
       _Var1._M_t.
       super__Tuple_impl<0UL,_oout::SuccessResult_*,_std::default_delete<oout::SuccessResult>_>.
       super__Head_base<0UL,_oout::SuccessResult_*,_false>._M_head_impl;
  std::unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_>::~unique_ptr
            ((unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)&local_18);
  std::unique_ptr<oout::SuccessResult,_std::default_delete<oout::SuccessResult>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> SkippedTest::result() const
{
	return make_unique<TestResult>(make_unique<SuccessResult>());
}